

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O2

int Abc_AigSetChoiceLevels(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int iVar3;
  int i;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    Abc_NtkIncrementTravId(pNtk);
    for (iVar3 = 0; iVar3 < pNtk->vCis->nSize; iVar3 = iVar3 + 1) {
      pAVar2 = Abc_NtkCi(pNtk,iVar3);
      Abc_NodeSetTravIdCurrent(pAVar2);
      (pAVar2->field_6).pTemp = (void *)0x0;
    }
    pAVar2 = Abc_AigConst1(pNtk);
    Abc_NodeSetTravIdCurrent(pAVar2);
    (pAVar2->field_6).pTemp = (void *)0x0;
    iVar3 = 0;
    for (i = 0; i < pNtk->vCos->nSize; i = i + 1) {
      pAVar2 = Abc_NtkCo(pNtk,i);
      iVar1 = Abc_NodeSetChoiceLevel_rec
                        ((Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray],1);
      if (iVar3 <= iVar1) {
        iVar3 = iVar1;
      }
    }
    return iVar3;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcDfs.c"
                ,0x707,"int Abc_AigSetChoiceLevels(Abc_Ntk_t *)");
}

Assistant:

int Abc_AigSetChoiceLevels( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int i, LevelMax, LevelCur;
    assert( Abc_NtkIsStrash(pNtk) );
    // set the new travid counter
    Abc_NtkIncrementTravId( pNtk );
    // set levels of the CI and constant
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        Abc_NodeSetTravIdCurrent( pObj );
        pObj->pCopy = NULL;
    }
    pObj = Abc_AigConst1( pNtk );
    Abc_NodeSetTravIdCurrent( pObj );
    pObj->pCopy = NULL;
    // set levels of all other nodes
    LevelMax = 0;
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        LevelCur = Abc_NodeSetChoiceLevel_rec( Abc_ObjFanin0(pObj), 1 );
        LevelMax = Abc_MaxInt( LevelMax, LevelCur );
    }
    return LevelMax;
}